

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void VR4_C(uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint8_t uVar7;
  uint uVar8;
  
  bVar1 = dst[-1];
  bVar2 = dst[-0x21];
  bVar3 = dst[-0x20];
  uVar8 = (uint)bVar3;
  bVar4 = dst[-0x1f];
  uVar6 = (uint)bVar4;
  bVar5 = dst[-0x1e];
  uVar7 = (uint8_t)((uint)bVar3 + (uint)bVar2 + 1 >> 1);
  dst[0x41] = uVar7;
  *dst = uVar7;
  uVar7 = (uint8_t)((uint)bVar3 + (uint)bVar4 + 1 >> 1);
  dst[0x42] = uVar7;
  dst[1] = uVar7;
  uVar7 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x43] = uVar7;
  dst[2] = uVar7;
  dst[3] = (uint8_t)((uint)bVar5 + (uint)dst[-0x1d] + 1 >> 1);
  dst[0x60] = (uint8_t)((uint)dst[0x3f] + (uint)bVar1 + 2 + (uint)dst[0x1f] * 2 >> 2);
  dst[0x40] = (uint8_t)((uint)dst[0x1f] + (uint)bVar2 + 2 + (uint)bVar1 * 2 >> 2);
  uVar7 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + uVar8 >> 2);
  dst[0x61] = uVar7;
  dst[0x20] = uVar7;
  uVar7 = (uint8_t)((uint)bVar2 + uVar8 * 2 + 2 + uVar6 >> 2);
  dst[0x62] = uVar7;
  dst[0x21] = uVar7;
  uVar7 = (uint8_t)(uVar8 + uVar6 * 2 + (uint)bVar5 + 2 >> 2);
  dst[99] = uVar7;
  dst[0x22] = uVar7;
  dst[0x23] = (uint8_t)(uVar6 + (uint)bVar5 * 2 + (uint)dst[-0x1d] + 2 >> 2);
  return;
}

Assistant:

static void VR4_C(uint8_t* dst) {   // Vertical-Right
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int X = dst[-1 - BPS];
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];
  const int D = dst[3 - BPS];
  DST(0, 0) = DST(1, 2) = AVG2(X, A);
  DST(1, 0) = DST(2, 2) = AVG2(A, B);
  DST(2, 0) = DST(3, 2) = AVG2(B, C);
  DST(3, 0)             = AVG2(C, D);

  DST(0, 3) =             AVG3(K, J, I);
  DST(0, 2) =             AVG3(J, I, X);
  DST(0, 1) = DST(1, 3) = AVG3(I, X, A);
  DST(1, 1) = DST(2, 3) = AVG3(X, A, B);
  DST(2, 1) = DST(3, 3) = AVG3(A, B, C);
  DST(3, 1) =             AVG3(B, C, D);
}